

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_div(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,rtosc_arg_val_t *res)

{
  rtosc_arg_val_t *res_local;
  rtosc_arg_val_t *rhs_local;
  rtosc_arg_val_t *lhs_local;
  int local_4;
  
  if (lhs->type == rhs->type) {
    res->type = lhs->type;
    switch(lhs->type) {
    case 'F':
      local_4 = 0;
      break;
    default:
      local_4 = 0;
      break;
    case 'T':
      res->type = 'T';
      (res->val).T = '\x01';
      local_4 = 1;
      break;
    case 'c':
    case 'i':
      (res->val).i = (lhs->val).i / (rhs->val).i;
      local_4 = 1;
      break;
    case 'd':
      (res->val).d = (lhs->val).d / (rhs->val).d;
      local_4 = 1;
      break;
    case 'f':
      (res->val).f = (lhs->val).f / (rhs->val).f;
      local_4 = 1;
      break;
    case 'h':
      (res->val).h = (lhs->val).h / (rhs->val).h;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int rtosc_arg_val_div(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      rtosc_arg_val_t* res)
{
    if(lhs->type != rhs->type)
        return false;
    res->type = lhs->type;
    switch(lhs->type)
    {
        case 'd': res->val.d = lhs->val.d / rhs->val.d; return true;
        case 'f': res->val.f = lhs->val.f / rhs->val.f; return true;
        case 'h': res->val.h = lhs->val.h / rhs->val.h; return true;
        case 'c':
        case 'i': res->val.i = lhs->val.i / rhs->val.i; return true;
        case 'T': res->type = 'T'; res->val.T = 1; return true;
        case 'F': assert(false); return false; // divide by 0
        default: return false;
    }
}